

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall BackwardPass::OptBlock(BackwardPass *this,BasicBlock *block)

{
  bool bVar1;
  
  Func::ThrowIfScriptClosed(this->func);
  if ((block->loop != (Loop *)0x0) && ((block->loop->field_0x178 & 4) == 0)) {
    ProcessLoop(this,block);
  }
  ProcessBlock(this,block);
  bVar1 = DoTrackNegativeZero(this);
  if (bVar1) {
    BVSparse<Memory::JitArenaAllocator>::ClearAll(this->negativeZeroDoesNotMatterBySymId);
  }
  bVar1 = DoTrackIntOverflow(this);
  if (bVar1) {
    BVSparse<Memory::JitArenaAllocator>::ClearAll(this->intOverflowDoesNotMatterBySymId);
    bVar1 = DoTrackCompoundedIntOverflow(this);
    if (bVar1) {
      BVSparse<Memory::JitArenaAllocator>::ClearAll(this->intOverflowDoesNotMatterInRangeBySymId);
      return;
    }
  }
  return;
}

Assistant:

void
BackwardPass::OptBlock(BasicBlock * block)
{
    this->func->ThrowIfScriptClosed();

    if (block->loop && !block->loop->hasDeadStorePrepass)
    {
        ProcessLoop(block);
    }

    this->ProcessBlock(block);

    if(DoTrackNegativeZero())
    {
        negativeZeroDoesNotMatterBySymId->ClearAll();
    }
    if (DoTrackBitOpsOrNumber())
    {
        symUsedOnlyForBitOpsBySymId->ClearAll();
        symUsedOnlyForNumberBySymId->ClearAll();
    }

    if(DoTrackIntOverflow())
    {
        intOverflowDoesNotMatterBySymId->ClearAll();
        if(DoTrackCompoundedIntOverflow())
        {
            intOverflowDoesNotMatterInRangeBySymId->ClearAll();
        }
    }
}